

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

bool anon_unknown.dwarf_1d436f::SubConditionHelper
               (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  uint uVar2;
  pointer pCVar3;
  bool result;
  unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  ptr;
  cmJSONState *state_local;
  Value *value_local;
  unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  *out_local;
  
  ptr._M_t.
  super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>,_true,_true>
        )(__uniq_ptr_data<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>,_true,_true>
          )state;
  std::
  unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>::
  unique_ptr<std::default_delete<cmCMakePresetsGraph::Condition>,void>
            ((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
              *)&stack0xffffffffffffffd0);
  out_local._7_1_ =
       ConditionHelper((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                        *)&stack0xffffffffffffffd0,value,
                       (cmJSONState *)
                       ptr._M_t.
                       super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                       .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl)
  ;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stack0xffffffffffffffd0);
  if (bVar1) {
    pCVar3 = std::
             unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             ::operator->((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           *)&stack0xffffffffffffffd0);
    uVar2 = (*pCVar3->_vptr_Condition[3])();
    if ((uVar2 & 1) != 0) {
      cmCMakePresetsErrors::INVALID_CONDITION
                (value,(cmJSONState *)
                       ptr._M_t.
                       super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                       .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl)
      ;
      out_local._7_1_ = false;
      goto LAB_0025fe10;
    }
  }
  std::
  unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>::
  operator=(out,(unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                 *)&stack0xffffffffffffffd0);
LAB_0025fe10:
  std::
  unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>::
  ~unique_ptr((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
               *)&stack0xffffffffffffffd0);
  return out_local._7_1_;
}

Assistant:

bool SubConditionHelper(std::unique_ptr<cmCMakePresetsGraph::Condition>& out,
                        const Json::Value* value, cmJSONState* state)
{
  std::unique_ptr<cmCMakePresetsGraph::Condition> ptr;
  auto result = ConditionHelper(ptr, value, state);
  if (ptr && ptr->IsNull()) {
    cmCMakePresetsErrors::INVALID_CONDITION(value, state);
    return false;
  }
  out = std::move(ptr);
  return result;
}